

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive_tester.cc
# Opt level: O2

void re2::ExhaustiveTest(int maxatoms,int maxops,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *alphabet,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *ops,int maxstrlen,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *stralphabet,string *wrapper,string *topwrapper)

{
  ExhaustiveTester t;
  LogMessageFatal local_198;
  
  if (FLAGS_quick_debug_mode == '\x01') {
    maxatoms = maxatoms - (uint)(1 < maxatoms);
    maxops = maxops - (uint)(1 < maxops);
    maxstrlen = maxstrlen - (uint)(1 < maxstrlen);
  }
  ExhaustiveTester::ExhaustiveTester
            (&t,maxatoms,maxops,alphabet,ops,maxstrlen,stralphabet,wrapper,topwrapper);
  RegexpGenerator::Generate(&t.super_RegexpGenerator);
  printf("%d regexps, %d tests, %d failures [%d/%d str]\n",(ulong)(uint)t.regexps_,
         (ulong)(uint)t.tests_,(ulong)(uint)t.failures_,(ulong)(uint)maxstrlen,
         (ulong)((long)(stralphabet->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(stralphabet->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (t.failures_ != 0) {
    LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/exhaustive_tester.cc"
               ,0xa7);
    std::operator<<((ostream *)&local_198.super_LogMessage.str_,
                    "Check failed: (0) == (t.failures())");
    LogMessageFatal::~LogMessageFatal(&local_198);
  }
  ExhaustiveTester::~ExhaustiveTester(&t);
  return;
}

Assistant:

void ExhaustiveTest(int maxatoms, int maxops,
                    const vector<string>& alphabet,
                    const vector<string>& ops,
                    int maxstrlen, const vector<string>& stralphabet,
                    const string& wrapper,
                    const string& topwrapper) {
  if (RE2_DEBUG_MODE && FLAGS_quick_debug_mode) {
    if (maxatoms > 1)
      maxatoms--;
    if (maxops > 1)
      maxops--;
    if (maxstrlen > 1)
      maxstrlen--;
  }
  ExhaustiveTester t(maxatoms, maxops, alphabet, ops,
                     maxstrlen, stralphabet, wrapper,
                     topwrapper);
  t.Generate();
  if (!LOGGING) {
    printf("%d regexps, %d tests, %d failures [%d/%d str]\n",
           t.regexps(), t.tests(), t.failures(), maxstrlen, (int)stralphabet.size());
  }
  EXPECT_EQ(0, t.failures());
}